

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarRemoveTab(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ImGuiTabBar *pIVar5;
  ImGuiTabBar *pIVar6;
  ImGuiTabBar *__dest;
  ulong uVar7;
  bool bVar8;
  
  if (tab_id != 0) {
    uVar3 = (ulong)(tab_bar->Tabs).Size;
    bVar8 = 0 < (long)uVar3;
    __dest = tab_bar;
    if (0 < (long)uVar3) {
      __dest = (ImGuiTabBar *)(tab_bar->Tabs).Data;
      bVar8 = true;
      if ((__dest->Tabs).Size != tab_id) {
        pIVar6 = __dest;
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          pIVar5 = (ImGuiTabBar *)((long)__dest + uVar3 * 0x20 + -0x20);
          if (uVar3 == uVar7) break;
          pIVar5 = (ImGuiTabBar *)&pIVar6->CurrFrameVisible;
          piVar1 = &pIVar6->CurrFrameVisible;
          pIVar6 = pIVar5;
          uVar2 = uVar7 + 1;
        } while (*piVar1 != tab_id);
        bVar8 = uVar7 < uVar3;
        __dest = pIVar5;
      }
    }
    if (bVar8) goto LAB_00191a49;
  }
  __dest = (ImGuiTabBar *)0x0;
LAB_00191a49:
  if (__dest != (ImGuiTabBar *)0x0) {
    pIVar6 = (ImGuiTabBar *)(tab_bar->Tabs).Data;
    if ((__dest < pIVar6) ||
       (lVar4 = (long)(tab_bar->Tabs).Size, (ImGuiTabBar *)(&pIVar6->Tabs + lVar4 * 2) <= __dest)) {
      __assert_fail("it >= Data && it < Data+Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x546,"T *ImVector<ImGuiTabItem>::erase(const T *) [T = ImGuiTabItem]");
    }
    memmove(__dest,&__dest->CurrFrameVisible,
            (lVar4 + ((ulong)~((long)__dest - (long)pIVar6) >> 5)) * 0x20);
    (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + -1;
  }
  if (tab_bar->VisibleTabId == tab_id) {
    tab_bar->VisibleTabId = 0;
  }
  if (tab_bar->SelectedTabId == tab_id) {
    tab_bar->SelectedTabId = 0;
  }
  if (tab_bar->NextSelectedTabId == tab_id) {
    tab_bar->NextSelectedTabId = 0;
  }
  return;
}

Assistant:

void ImGui::TabBarRemoveTab(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
        tab_bar->Tabs.erase(tab);
    if (tab_bar->VisibleTabId == tab_id)      { tab_bar->VisibleTabId = 0; }
    if (tab_bar->SelectedTabId == tab_id)     { tab_bar->SelectedTabId = 0; }
    if (tab_bar->NextSelectedTabId == tab_id) { tab_bar->NextSelectedTabId = 0; }
}